

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  int ret;
  char **argv_local;
  int argc_local;
  
  uVar1 = debug_test();
  uVar2 = emit_test();
  return uVar2 | uVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    int ret = 0;

    (void)argc;
    (void)argv;

    ret |= debug_test();
    ret |= emit_test();
    return ret;
}